

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

const_iterator __thiscall
frozen::set<frozen::basic_string<char>,_3UL,_std::less<frozen::basic_string<char>_>_>::
lower_bound<char[2]>
          (set<frozen::basic_string<char>,_3UL,_std::less<frozen::basic_string<char>_>_> *this,
          char (*key) [2])

{
  ulong uVar1;
  const_iterator pvVar2;
  ulong uVar3;
  
  if ((this->keys_).data_[1].size_ == 0) {
    uVar3 = 0x20;
  }
  else {
    uVar3 = (ulong)(*(this->keys_).data_[1].data_ < (*key)[0]) << 5;
  }
  if (*(long *)((long)&(this->keys_).data_[0].size_ + uVar3) == 0) {
    uVar1 = 0x10;
  }
  else {
    uVar1 = (ulong)(**(char **)((long)&(this->keys_).data_[0].data_ + uVar3) < (*key)[0]) << 4;
  }
  if ((uVar1 | uVar3) != 0x30) {
    pvVar2 = (const_iterator)((long)&(this->keys_).data_[0].data_ + (uVar1 | uVar3));
    if (pvVar2->size_ == 0) {
      return pvVar2;
    }
    if ((*pvVar2->data_ <= (*key)[0]) && (pvVar2->size_ == 1 || *pvVar2->data_ < (*key)[0])) {
      return pvVar2;
    }
  }
  return (const_iterator)(this + 1);
}

Assistant:

constexpr bool operator<(const basic_string &other) const {
    unsigned i = 0;
    while (i < size() && i < other.size()) {
      if ((*this)[i] < other[i]) {
        return true;
      }
      if ((*this)[i] > other[i]) {
        return false;
      }
      ++i;
    }
    return size() < other.size();
  }